

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O3

i32_t Kumu::base64decode(char *str,byte_t *buf,ui32_t buf_len,ui32_t *char_count)

{
  char cVar1;
  i32_t iVar2;
  int iVar3;
  ui32_t uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  
  iVar2 = -1;
  if (char_count != (ui32_t *)0x0 && (buf != (byte_t *)0x0 && str != (char *)0x0)) {
    iVar2 = 0;
    uVar4 = 0;
    if (buf_len != 0) {
      uVar5 = 0;
      iVar3 = 0;
      bVar6 = 0;
      do {
        do {
          uVar4 = (ui32_t)uVar5;
          cVar1 = *str;
          if ((long)cVar1 == 0) goto LAB_00117db5;
          str = str + 1;
          bVar7 = decode_map[cVar1];
        } while (bVar7 == 0xff);
        if (cVar1 == '=') break;
        switch(iVar3) {
        case 0:
          buf[uVar5] = bVar7 << 2;
          iVar3 = 1;
          uVar5 = (ulong)(uVar4 + 1);
          bVar7 = bVar6;
          break;
        case 1:
          buf[uVar4 - 1] = buf[uVar4 - 1] | bVar7 >> 4;
          iVar3 = 2;
          break;
        case 2:
          buf[uVar5] = bVar7 >> 2 | bVar6 << 4;
          iVar3 = 3;
          uVar5 = (ulong)(uVar4 + 1);
          break;
        case 3:
          buf[uVar5] = bVar7 | bVar6 << 6;
          iVar3 = 0;
          uVar5 = (ulong)(uVar4 + 1);
          bVar7 = bVar6;
          break;
        default:
          iVar3 = iVar3 + 1;
          bVar7 = bVar6;
        }
        uVar4 = (ui32_t)uVar5;
        bVar6 = bVar7;
      } while (uVar4 < buf_len);
    }
LAB_00117db5:
    *char_count = uVar4;
  }
  return iVar2;
}

Assistant:

i32_t
Kumu::base64decode(const char* str, byte_t* buf, ui32_t buf_len, ui32_t* char_count)
{
  byte_t c = 0, d = 0;
  ui32_t phase = 0, i = 0;

  if ( str == 0 || buf == 0 || char_count == 0 )
    return -1;

  while ( *str != 0 && i < buf_len )
    {
      c = decode_map[(int)*str++];
      if ( c == 0xff ) continue;
      if ( c == 0xfe ) break;

      switch ( phase++ )
	{
	case 0:
	  buf[i++] =  c << 2;
	  break;

	case 1:
	  buf[i - 1] |= c >> 4;
	  d = c;
	  break;

	case 2:
	  buf[i++] =  ( d << 4 ) | ( c >> 2 );
	  d = c;
	  break;

	case 3:
	  buf[i++] =  ( d << 6 ) | c;
	  phase = 0;
	  break;
	}
    }

  *char_count = i;
  return 0;
}